

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsMipAnalysis.cpp
# Opt level: O1

void __thiscall HighsMipAnalysis::setupMipTime(HighsMipAnalysis *this,HighsOptions *options)

{
  uint uVar1;
  MipTimer mip_timer;
  HighsTimerClock clock;
  MipTimer local_29;
  HighsTimerClock local_28;
  
  uVar1 = (options->super_HighsOptionsStruct).highs_analysis_level & 0x80;
  this->analyse_mip_time = SUB41(uVar1 >> 7,0);
  if (uVar1 != 0) {
    local_28.clock_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_28.clock_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_28.clock_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_28.timer_pointer_ = this->timer_;
    MipTimer::initialiseMipClocks(&local_29,&local_28);
    (this->mip_clocks).timer_pointer_ = local_28.timer_pointer_;
    std::vector<int,_std::allocator<int>_>::operator=(&(this->mip_clocks).clock_,&local_28.clock_);
    if (local_28.clock_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_28.clock_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  return;
}

Assistant:

void HighsMipAnalysis::setupMipTime(const HighsOptions& options) {
  analyse_mip_time = kHighsAnalysisLevelMipTime & options.highs_analysis_level;
  if (analyse_mip_time) {
    HighsTimerClock clock;
    clock.timer_pointer_ = timer_;
    MipTimer mip_timer;
    mip_timer.initialiseMipClocks(clock);
    mip_clocks = clock;
  }
}